

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

string * bloaty::ItaniumDemangle_abi_cxx11_(string_view symbol,DataSource source)

{
  string_view prefix;
  string_view text;
  bool bVar1;
  char *__ptr;
  uint in_ECX;
  string *in_RDI;
  char *demangled_1;
  char demangled [1024];
  string_view demangle_from;
  string *ret;
  int *in_stack_00000c20;
  size_t *in_stack_00000c28;
  char *in_stack_00000c30;
  char *in_stack_00000c38;
  char *in_stack_fffffffffffffb48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb50;
  size_t in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  size_t in_stack_fffffffffffffb68;
  string *psVar2;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  undefined1 uVar3;
  allocator<char> local_46a;
  allocator<char> local_469 [1065];
  basic_string_view<char,_std::char_traits<char>_> local_40 [2];
  allocator<char> local_1d;
  uint local_1c;
  
  psVar2 = in_RDI;
  if ((in_ECX == 10) || (in_ECX == 9)) {
    local_1c = in_ECX;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
    text._M_str = (char *)in_RDI;
    text._M_len = in_stack_fffffffffffffb68;
    prefix._M_str = in_stack_fffffffffffffb60;
    prefix._M_len = in_stack_fffffffffffffb58;
    bVar1 = absl::StartsWith(text,prefix);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(local_40,1);
    }
    if (local_1c == 10) {
      std::basic_string_view<char,_std::char_traits<char>_>::data(local_40);
      bVar1 = absl::debugging_internal::Demangle
                        ((char *)psVar2,(char *)in_RDI,in_stack_fffffffffffffb68);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),(char *)psVar2,
                   (allocator<char> *)in_RDI);
        std::allocator<char>::~allocator(local_469);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                   (basic_string_view<char,_std::char_traits<char>_> *)psVar2,
                   (allocator<char> *)in_RDI);
        std::allocator<char>::~allocator(&local_46a);
      }
    }
    else {
      if (local_1c != 9) {
        printf("Unexpected source: %d\n",(ulong)local_1c);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                      ,199,"std::string bloaty::ItaniumDemangle(string_view, DataSource)");
      }
      std::basic_string_view<char,_std::char_traits<char>_>::data(local_40);
      __ptr = __cxa_demangle(in_stack_00000c38,in_stack_00000c30,in_stack_00000c28,in_stack_00000c20
                            );
      if (__ptr == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                   (basic_string_view<char,_std::char_traits<char>_> *)psVar2,
                   (allocator<char> *)in_RDI);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb85);
      }
      else {
        uVar3 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar3,in_stack_fffffffffffffb80),(char *)psVar2,
                   (allocator<char> *)in_RDI);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb86);
        free(__ptr);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
               (basic_string_view<char,_std::char_traits<char>_> *)psVar2,(allocator<char> *)in_RDI)
    ;
    std::allocator<char>::~allocator(&local_1d);
  }
  return psVar2;
}

Assistant:

std::string ItaniumDemangle(string_view symbol, DataSource source) {
  if (source != DataSource::kShortSymbols &&
      source != DataSource::kFullSymbols) {
    // No demangling.
    return std::string(symbol);
  }

  string_view demangle_from = symbol;
  if (absl::StartsWith(demangle_from, "__Z")) {
    demangle_from.remove_prefix(1);
  }

  if (source == DataSource::kShortSymbols) {
    char demangled[1024];
    if (absl::debugging_internal::Demangle(demangle_from.data(), demangled,
                                           sizeof(demangled))) {
      return std::string(demangled);
    } else {
      return std::string(symbol);
    }
  } else if (source == DataSource::kFullSymbols) {
    char* demangled = __cxa_demangle(demangle_from.data(), NULL, NULL, NULL);
    if (demangled) {
      std::string ret(demangled);
      free(demangled);
      return ret;
    } else {
      return std::string(symbol);
    }
  } else {
    printf("Unexpected source: %d\n", (int)source);
    BLOATY_UNREACHABLE();
  }
}